

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.hpp
# Opt level: O2

String * __thiscall doctest::String::operator+=(String *this,String *other)

{
  char *in;
  char *in_00;
  size_t sVar1;
  size_t sVar2;
  char *__dest;
  
  in = other->m_str;
  if (in != (char *)0x0) {
    in_00 = this->m_str;
    sVar1 = detail::my_strlen(in_00);
    sVar2 = detail::my_strlen(in);
    __dest = (char *)malloc(sVar1 + sVar2 + 1);
    strcpy(__dest,in_00);
    sVar1 = detail::my_strlen(in_00);
    strcpy(__dest + sVar1,in);
    free(in_00);
    this->m_str = __dest;
  }
  return this;
}

Assistant:

String& String::operator+=(const String& other) {
    using namespace detail;
    if(other.m_str != 0) {
        char* newStr = static_cast<char*>(malloc(my_strlen(m_str) + my_strlen(other.m_str) + 1));
        strcpy(newStr, m_str);
        strcpy(newStr + my_strlen(m_str), other.m_str);
        free(m_str);
        m_str = newStr;
    }
    return *this;
}